

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1cod.c
# Opt level: O0

void jpc_initluts(void)

{
  float fVar1;
  uint_least8_t uVar2;
  _Bool _Var3;
  uint uVar4;
  double dVar5;
  double dVar6;
  float local_1c;
  float t;
  float v;
  float u;
  int refine;
  int orient;
  int i;
  
  jpc_initmqctxs();
  for (u = 0.0; (int)u < 4; u = (float)((int)u + 1)) {
    for (refine = 0; refine < 0x100; refine = refine + 1) {
      uVar2 = jpc_getzcctxno(refine,(int)u);
      jpc_zcctxnolut[(int)u << 8 | refine] = uVar2;
    }
  }
  for (refine = 0; refine < 0x100; refine = refine + 1) {
    _Var3 = jpc_getspb(refine << 4);
    jpc_spblut[refine] = _Var3;
  }
  for (refine = 0; refine < 0x100; refine = refine + 1) {
    uVar2 = jpc_getscctxno(refine << 4);
    jpc_scctxnolut[refine] = uVar2;
  }
  for (v = 0.0; (int)v < 2; v = (float)((int)v + 1)) {
    for (refine = 0; refine < 0x800; refine = refine + 1) {
      uVar4 = 0;
      if (v != 0.0) {
        uVar4 = 0x2000;
      }
      uVar2 = jpc_getmagctxno(uVar4 | refine);
      jpc_magctxnolut[(int)v * 0x800 + refine] = uVar2;
    }
  }
  for (refine = 0; refine < 0x80; refine = refine + 1) {
    dVar5 = jpc_pow2i(-6);
    local_1c = (float)((double)refine * dVar5);
    dVar5 = jpc_pow2i(6);
    dVar5 = floor((double)(local_1c * local_1c + -((local_1c - 1.5) * (local_1c - 1.5))) * dVar5 +
                  0.5);
    dVar6 = jpc_pow2i(6);
    jpc_signmsedec[refine] = (long)((dVar5 / dVar6) * 8192.0);
    dVar5 = jpc_pow2i(6);
    dVar5 = floor((double)(local_1c * local_1c) * dVar5 + 0.5);
    dVar6 = jpc_pow2i(6);
    jpc_signmsedec0[refine] = (long)((dVar5 / dVar6) * 8192.0);
    fVar1 = local_1c - 1.0;
    if ((refine & 0x40U) == 0) {
      local_1c = local_1c - 0.5;
    }
    else {
      local_1c = local_1c - 1.5;
    }
    dVar5 = jpc_pow2i(6);
    dVar5 = floor((double)(fVar1 * fVar1 + -(local_1c * local_1c)) * dVar5 + 0.5);
    dVar6 = jpc_pow2i(6);
    jpc_refnmsedec[refine] = (long)((dVar5 / dVar6) * 8192.0);
    dVar5 = jpc_pow2i(6);
    dVar5 = floor((double)(fVar1 * fVar1) * dVar5 + 0.5);
    dVar6 = jpc_pow2i(6);
    jpc_refnmsedec0[refine] = (long)((dVar5 / dVar6) * 8192.0);
  }
  return;
}

Assistant:

void jpc_initluts()
{
	int i;
	int orient;
	int refine;
	float u;
	float v;
	float t;

/* XXX - hack */
jpc_initmqctxs();

	for (orient = 0; orient < 4; ++orient) {
		for (i = 0; i < 256; ++i) {
			jpc_zcctxnolut[(orient << 8) | i] = jpc_getzcctxno(i, orient);
		}
	}

	for (i = 0; i < 256; ++i) {
		jpc_spblut[i] = jpc_getspb(i << 4);
	}

	for (i = 0; i < 256; ++i) {
		jpc_scctxnolut[i] = jpc_getscctxno(i << 4);
	}

	for (refine = 0; refine < 2; ++refine) {
		for (i = 0; i < 2048; ++i) {
			jpc_magctxnolut[(refine << 11) + i] = jpc_getmagctxno((refine ? JPC_REFINE : 0) | i);
		}
	}

	for (i = 0; i < (1 << JPC_NMSEDEC_BITS); ++i) {
		t = i * jpc_pow2i(-JPC_NMSEDEC_FRACBITS);
		u = t;
		v = t - 1.5;
		jpc_signmsedec[i] = jpc_dbltofix(floor((u * u - v * v) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
/* XXX - this calc is not correct */
		jpc_signmsedec0[i] = jpc_dbltofix(floor((u * u) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
		u = t - 1.0;
		if (i & (1 << (JPC_NMSEDEC_BITS - 1))) {
			v = t - 1.5;
		} else {
			v = t - 0.5;
		}
		jpc_refnmsedec[i] = jpc_dbltofix(floor((u * u - v * v) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
/* XXX - this calc is not correct */
		jpc_refnmsedec0[i] = jpc_dbltofix(floor((u * u) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
	}
}